

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O1

bool __thiscall llvm::DWARFFormValue::isFormClass(DWARFFormValue *this,FormClass FC)

{
  Form FVar1;
  
  FVar1 = this->Form;
  if (((ulong)FVar1 < 0x2d) && (DWARF5FormClasses[FVar1] == FC)) {
    return true;
  }
  if (FVar1 < DW_FORM_GNU_ref_alt) {
    if (FVar1 == DW_FORM_GNU_addr_index) {
      return FC == FC_Address;
    }
    if (FVar1 == DW_FORM_GNU_str_index) {
LAB_00d8b150:
      return FC == FC_String;
    }
  }
  else {
    if (FVar1 == DW_FORM_GNU_strp_alt) goto LAB_00d8b150;
    if (FVar1 == DW_FORM_GNU_ref_alt) {
      return FC == FC_Reference;
    }
  }
  if (FC == FC_SectionOffset) {
    if (FVar1 - 6 < 2) {
      if (this->U == (DWARFUnit *)0x0) {
        return true;
      }
      return (this->U->Header).FormParams.Version < 4;
    }
    if (FVar1 == DW_FORM_strp) {
      return true;
    }
    if (FVar1 == DW_FORM_line_strp) {
      return true;
    }
  }
  return false;
}

Assistant:

bool DWARFFormValue::isFormClass(DWARFFormValue::FormClass FC) const {
  // First, check DWARF5 form classes.
  if (Form < makeArrayRef(DWARF5FormClasses).size() &&
      DWARF5FormClasses[Form] == FC)
    return true;
  // Check more forms from extensions and proposals.
  switch (Form) {
  case DW_FORM_GNU_ref_alt:
    return (FC == FC_Reference);
  case DW_FORM_GNU_addr_index:
    return (FC == FC_Address);
  case DW_FORM_GNU_str_index:
  case DW_FORM_GNU_strp_alt:
    return (FC == FC_String);
  default:
    break;
  }

  if (FC == FC_SectionOffset) {
    if (Form == DW_FORM_strp || Form == DW_FORM_line_strp)
      return true;
    // In DWARF3 DW_FORM_data4 and DW_FORM_data8 served also as a section
    // offset. If we don't have a DWARFUnit, default to the old behavior.
    if (Form == DW_FORM_data4 || Form == DW_FORM_data8)
      return !U || U->getVersion() <= 3;
  }

  return false;
}